

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xinput.c
# Opt level: O3

int xcb_input_input_state_data_serialize
              (void **_buffer,uint8_t class_id,xcb_input_input_state_data_t *_aux)

{
  anon_struct_34_3_966d0470_for_button *paVar1;
  uint uVar2;
  void *__dest;
  int iVar3;
  int iVar4;
  int iVar5;
  undefined7 in_register_00000031;
  ulong uVar6;
  size_t __n;
  int iVar7;
  long in_FS_OFFSET;
  char xcb_pad0 [3];
  iovec xcb_parts [11];
  uint local_f0;
  undefined2 local_ec;
  undefined1 local_ea;
  xcb_input_input_state_data_t *local_e8;
  ulong local_e0;
  uint8_t *local_d8;
  undefined8 local_d0;
  uint8_t *local_c8;
  long local_c0;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  __dest = *_buffer;
  local_ea = 0;
  local_ec = 0;
  memset(&local_e8,0xaa,0xb0);
  iVar4 = (int)CONCAT71(in_register_00000031,class_id);
  if (iVar4 == 2) {
    local_e8 = (xcb_input_input_state_data_t *)&_aux->valuator;
    local_e0 = 1;
    local_d8 = &(_aux->valuator).mode;
    local_d0 = 1;
    local_c8 = (uint8_t *)(_aux->valuator).valuators;
    local_c0 = (ulong)(_aux->valuator).num_valuators << 2;
    iVar3 = (int)local_c0;
    iVar4 = 0;
    uVar2 = 3;
    iVar5 = 2;
  }
  else {
    if (iVar4 == 1) {
      local_e8 = (xcb_input_input_state_data_t *)&_aux->button;
      local_e0 = 1;
      local_d8 = (uint8_t *)&local_f0;
      local_d0 = 1;
      paVar1 = &_aux->button;
    }
    else {
      if (iVar4 != 0) {
        iVar4 = -2;
        uVar2 = 0xffffffff;
        iVar5 = 0;
        iVar7 = 0;
        iVar3 = 0;
        goto LAB_001886b1;
      }
      local_e8 = _aux;
      local_e0 = 1;
      local_d8 = (uint8_t *)&local_f0;
      local_d0 = 1;
      paVar1 = (anon_struct_34_3_966d0470_for_button *)&_aux->key;
    }
    local_c8 = paVar1->buttons;
    iVar3 = 0x22;
    iVar4 = -2;
    iVar5 = 0;
    local_c0 = 0x20;
    uVar2 = 0;
  }
  local_d0 = 1;
  local_e0 = 1;
  iVar7 = 3;
LAB_001886b1:
  uVar2 = iVar4 - iVar3 & uVar2;
  local_f0 = uVar2;
  if (uVar2 != 0) {
    *(undefined2 **)((long)&local_e8 + (ulong)(uint)(iVar7 << 4)) = &local_ec;
    *(ulong *)((long)&local_e0 + (ulong)(uint)(iVar7 << 4)) = (ulong)uVar2;
    iVar7 = iVar7 + 1;
    local_f0 = 0;
  }
  uVar2 = iVar5 + iVar3 + uVar2;
  if (__dest == (void *)0x0) {
    __dest = malloc((ulong)uVar2);
    *_buffer = __dest;
  }
  if (iVar7 != 0) {
    uVar6 = 0;
    do {
      __n = *(size_t *)((long)&local_e0 + uVar6);
      if (*(void **)((long)&local_e8 + uVar6) != (void *)0x0) {
        if (__n == 0) {
          __n = 0;
        }
        else {
          memcpy(__dest,*(void **)((long)&local_e8 + uVar6),__n);
        }
      }
      __dest = (void *)((long)__dest + __n);
      uVar6 = uVar6 + 0x10;
    } while ((uint)(iVar7 << 4) != uVar6);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return uVar2;
  }
  __stack_chk_fail();
}

Assistant:

int
xcb_input_input_state_data_serialize (void                               **_buffer,
                                      uint8_t                              class_id,
                                      const xcb_input_input_state_data_t  *_aux)
{
    char *xcb_out = *_buffer;
    unsigned int xcb_buffer_len = 0;
    unsigned int xcb_align_to = 0;
    unsigned int xcb_padding_offset = 2;

    unsigned int xcb_pad = 0;
    char xcb_pad0[3] = {0, 0, 0};
    struct iovec xcb_parts[11];
    unsigned int xcb_parts_idx = 0;
    unsigned int xcb_block_len = 0;
    unsigned int i;
    char *xcb_tmp;

    if(class_id == XCB_INPUT_INPUT_CLASS_KEY) {
        /* xcb_input_input_state_data_t.key.num_keys */
        xcb_parts[xcb_parts_idx].iov_base = (char *) &_aux->key.num_keys;
        xcb_block_len += sizeof(uint8_t);
        xcb_parts[xcb_parts_idx].iov_len = sizeof(uint8_t);
        xcb_parts_idx++;
        xcb_align_to = ALIGNOF(uint8_t);
        /* xcb_input_input_state_data_t.key.pad0 */
        xcb_parts[xcb_parts_idx].iov_base = (char *) &xcb_pad;
        xcb_block_len += sizeof(uint8_t);
        xcb_parts[xcb_parts_idx].iov_len = sizeof(uint8_t);
        xcb_parts_idx++;
        xcb_align_to = ALIGNOF(uint8_t);
        /* xcb_input_input_state_data_t.key.keys */
        xcb_parts[xcb_parts_idx].iov_base = (char *) _aux->key.keys;
        xcb_block_len += 32;
        xcb_parts[xcb_parts_idx].iov_len = 32;
        xcb_parts_idx++;
        xcb_align_to = ALIGNOF(uint8_t);
    }
    if(class_id == XCB_INPUT_INPUT_CLASS_BUTTON) {
        /* xcb_input_input_state_data_t.button.num_buttons */
        xcb_parts[xcb_parts_idx].iov_base = (char *) &_aux->button.num_buttons;
        xcb_block_len += sizeof(uint8_t);
        xcb_parts[xcb_parts_idx].iov_len = sizeof(uint8_t);
        xcb_parts_idx++;
        xcb_align_to = ALIGNOF(uint8_t);
        /* xcb_input_input_state_data_t.button.pad1 */
        xcb_parts[xcb_parts_idx].iov_base = (char *) &xcb_pad;
        xcb_block_len += sizeof(uint8_t);
        xcb_parts[xcb_parts_idx].iov_len = sizeof(uint8_t);
        xcb_parts_idx++;
        xcb_align_to = ALIGNOF(uint8_t);
        /* xcb_input_input_state_data_t.button.buttons */
        xcb_parts[xcb_parts_idx].iov_base = (char *) _aux->button.buttons;
        xcb_block_len += 32;
        xcb_parts[xcb_parts_idx].iov_len = 32;
        xcb_parts_idx++;
        xcb_align_to = ALIGNOF(uint8_t);
    }
    if(class_id == XCB_INPUT_INPUT_CLASS_VALUATOR) {
        /* xcb_input_input_state_data_t.valuator.num_valuators */
        xcb_parts[xcb_parts_idx].iov_base = (char *) &_aux->valuator.num_valuators;
        xcb_block_len += sizeof(uint8_t);
        xcb_parts[xcb_parts_idx].iov_len = sizeof(uint8_t);
        xcb_parts_idx++;
        xcb_align_to = ALIGNOF(uint8_t);
        /* xcb_input_input_state_data_t.valuator.mode */
        xcb_parts[xcb_parts_idx].iov_base = (char *) &_aux->valuator.mode;
        xcb_block_len += sizeof(uint8_t);
        xcb_parts[xcb_parts_idx].iov_len = sizeof(uint8_t);
        xcb_parts_idx++;
        xcb_align_to = ALIGNOF(uint8_t);
        /* insert padding */
        xcb_pad = -(xcb_block_len + xcb_padding_offset) & (xcb_align_to - 1);
        xcb_buffer_len += xcb_block_len + xcb_pad;
        if (0 != xcb_pad) {
            xcb_parts[xcb_parts_idx].iov_base = xcb_pad0;
            xcb_parts[xcb_parts_idx].iov_len = xcb_pad;
            xcb_parts_idx++;
            xcb_pad = 0;
        }
        xcb_block_len = 0;
        xcb_padding_offset = 0;
        /* valuators */
        xcb_parts[xcb_parts_idx].iov_base = (char *) _aux->valuator.valuators;
        xcb_block_len += _aux->valuator.num_valuators * sizeof(int32_t);
        xcb_parts[xcb_parts_idx].iov_len = _aux->valuator.num_valuators * sizeof(int32_t);
        xcb_parts_idx++;
        xcb_align_to = ALIGNOF(int32_t);
    }
    /* insert padding */
    xcb_pad = -(xcb_block_len + xcb_padding_offset) & (xcb_align_to - 1);
    xcb_buffer_len += xcb_block_len + xcb_pad;
    if (0 != xcb_pad) {
        xcb_parts[xcb_parts_idx].iov_base = xcb_pad0;
        xcb_parts[xcb_parts_idx].iov_len = xcb_pad;
        xcb_parts_idx++;
        xcb_pad = 0;
    }
    xcb_block_len = 0;
    xcb_padding_offset = 0;

    if (NULL == xcb_out) {
        /* allocate memory */
        xcb_out = malloc(xcb_buffer_len);
        *_buffer = xcb_out;
    }

    xcb_tmp = xcb_out;
    for(i=0; i<xcb_parts_idx; i++) {
        if (0 != xcb_parts[i].iov_base && 0 != xcb_parts[i].iov_len)
            memcpy(xcb_tmp, xcb_parts[i].iov_base, xcb_parts[i].iov_len);
        if (0 != xcb_parts[i].iov_len)
            xcb_tmp += xcb_parts[i].iov_len;
    }

    return xcb_buffer_len;
}